

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O0

size_t dg::ADT::
       SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
       ::_countBits(unsigned_long bits)

{
  size_t num;
  unsigned_long bits_local;
  
  num = 0;
  for (bits_local = bits; bits_local != 0; bits_local = bits_local >> 1) {
    if ((bits_local & 1) != 0) {
      num = num + 1;
    }
  }
  return num;
}

Assistant:

static size_t _countBits(BitsT bits) {
        size_t num = 0;
        while (bits) {
            if (bits & 0x1)
                ++num;

            bits = bits >> 1;
        }

        return num;
    }